

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

void __thiscall
QRhiResourceUpdateBatchPrivate::free(QRhiResourceUpdateBatchPrivate *this,void *__ptr)

{
  bool bVar1;
  quint32 qVar2;
  const_iterator pBVar3;
  long in_FS_OFFSET;
  quint64 mask;
  BufferOp *op;
  const_iterator __end1;
  const_iterator __begin1;
  add_const_t<QVarLengthArray<QRhiResourceUpdateBatchPrivate::BufferOp,_64LL>_> *__range1;
  quint32 bufferLargeAllocTotal;
  quint32 bufferDataTotal;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  QVLABase<QRhiResourceUpdateBatchPrivate::TextureOp> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  QDebug *in_stack_ffffffffffffff98;
  const_iterator local_50;
  uint local_40;
  QRhiResourceUpdateBatchPrivate *t;
  QDebug local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = 0;
  t = this;
  local_50 = QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>::begin
                       ((QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp> *)0x69596d);
  pBVar3 = QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>::end
                     ((QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp> *)
                      in_stack_ffffffffffffff80);
  for (; local_50 != pBVar3; local_50 = local_50 + 1) {
    QRhiBufferData::size(&local_50->data);
    qVar2 = QRhiBufferData::largeAlloc((QRhiBufferData *)in_stack_ffffffffffffff80);
    local_40 = qVar2 + local_40;
  }
  QtPrivateLogging::QRHI_LOG_RUB();
  bVar1 = QLoggingCategory::isDebugEnabled((QLoggingCategory *)0x6959ef);
  if (bVar1) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this,in_stack_ffffffffffffff88,
               (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    QMessageLogger::debug();
    QDebug::operator<<(in_stack_ffffffffffffff98,(char *)t);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    QDebug::operator<<(in_stack_ffffffffffffff98,(char *)t);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    in_stack_ffffffffffffff80 =
         (QVLABase<QRhiResourceUpdateBatchPrivate::TextureOp> *)
         QDebug::operator<<(in_stack_ffffffffffffff98,(char *)t);
    QVarLengthArray<QRhiResourceUpdateBatchPrivate::BufferOp,_64LL>::count
              ((QVarLengthArray<QRhiResourceUpdateBatchPrivate::BufferOp,_64LL> *)0x695a7e);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff80,
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    QDebug::operator<<(in_stack_ffffffffffffff98,(char *)t);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    QDebug::operator<<(in_stack_ffffffffffffff98,(char *)t);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    QDebug::operator<<(in_stack_ffffffffffffff98,(char *)t);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    QDebug::operator<<(in_stack_ffffffffffffff98,(char *)t);
    QVarLengthArray<QRhiResourceUpdateBatchPrivate::TextureOp,_32LL>::count
              ((QVarLengthArray<QRhiResourceUpdateBatchPrivate::TextureOp,_32LL> *)0x695b08);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff80,
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    QDebug::~QDebug(&local_10);
  }
  this->activeBufferOpCount = 0;
  this->activeTextureOpCount = 0;
  this->rhi->resUpdPoolMap =
       (1L << ((byte)this->poolIndex & 0x3f) ^ 0xffffffffffffffffU) & this->rhi->resUpdPoolMap;
  this->poolIndex = -1;
  QVLABase<QRhiResourceUpdateBatchPrivate::TextureOp>::clear(in_stack_ffffffffffffff80);
  if (0x100000 < local_40) {
    QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>::clear
              ((QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp> *)in_stack_ffffffffffffff80);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiResourceUpdateBatchPrivate::free()
{
    Q_ASSERT(poolIndex >= 0 && rhi->resUpdPool[poolIndex] == q);

    quint32 bufferDataTotal = 0;
    quint32 bufferLargeAllocTotal = 0;
    for (const BufferOp &op : std::as_const(bufferOps)) {
        bufferDataTotal += op.data.size();
        bufferLargeAllocTotal += op.data.largeAlloc(); // alloc when > 1 KB
    }

    if (QRHI_LOG_RUB().isDebugEnabled()) {
        qDebug() << "[rub] release to pool upd.batch #" << poolIndex
                << "/ bufferOps active" << activeBufferOpCount
                << "of" << bufferOps.count()
                << "data" << bufferDataTotal
                << "largeAlloc" << bufferLargeAllocTotal
                << "textureOps active" << activeTextureOpCount
                << "of" << textureOps.count();
    }

    activeBufferOpCount = 0;
    activeTextureOpCount = 0;

    const quint64 mask = 1ULL << quint64(poolIndex);
    rhi->resUpdPoolMap &= ~mask;
    poolIndex = -1;

    // textureOps is cleared, to not keep the potentially large image pixel
    // data alive, but it is expected that the container keeps the list alloc
    // at least. Only trimOpList() goes for the more aggressive route with squeeze.
    textureOps.clear();

    // bufferOps is not touched in many cases, to allow reusing allocations
    // (incl. in the elements' QRhiBufferData) as much as possible when this
    // batch is used again in the future, which is important for performance, in
    // particular with Qt Quick where it is easy for scenes to produce lots of,
    // typically small buffer changes on every frame.
    //
    // However, ensure that even in the unlikely case of having the max number
    // of batches (64) created in resUpdPool, no more than 64 MB in total is
    // used up by buffer data just to help future reuse. For simplicity, if
    // there is more than 1 MB data -> clear. Applications with frequent, huge
    // buffer updates probably have other bottlenecks anyway.
    if (bufferLargeAllocTotal > 1024 * 1024)
        bufferOps.clear();
}